

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall
cmCTest::OutputTestErrors(cmCTest *this,vector<char,_std::allocator<char>_> *process_output)

{
  pointer pcVar1;
  ostream *poVar2;
  string test_outputs;
  char *local_1a8 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_outputs,"\n*** Test Failed:\n",(allocator<char> *)&cmCTestLog_msg);
  pcVar1 = (process_output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (process_output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)&test_outputs,(ulong)pcVar1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&test_outputs);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,2,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmCTest.cxx"
      ,0xc7d,local_1a8[0],false);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&test_outputs);
  return;
}

Assistant:

void cmCTest::OutputTestErrors(std::vector<char> const& process_output)
{
  std::string test_outputs("\n*** Test Failed:\n");
  if (!process_output.empty()) {
    test_outputs.append(process_output.data(), process_output.size());
  }
  cmCTestLog(this, HANDLER_OUTPUT, test_outputs << std::endl << std::flush);
}